

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  function_type *local_40;
  thread local_38;
  thread talker;
  duration<long,_std::ratio<1L,_1000L>_> local_20;
  function_type *local_18;
  thread local_10;
  thread responder;
  
  local_18 = responsive_thread;
  std::thread::thread<void(*)(),,void>(&local_10,&local_18);
  local_20.__r = (rep)ms<(char)53,(char)48,(char)48>();
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_20);
  local_40 = talkative_thread;
  std::thread::thread<void(*)(),,void>(&local_38,&local_40);
  std::thread::join();
  std::thread::join();
  std::thread::~thread(&local_38);
  std::thread::~thread(&local_10);
  return 0;
}

Assistant:

int
main()
{
  std::thread responder(&responsive_thread);
  std::this_thread::sleep_for(500ms);
  std::thread talker(&talkative_thread);
  responder.join();
  talker.join();
}